

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

int Gia_NodeDeref_rec(Gia_Man_t *p,Gia_Obj_t *pNode)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  uVar3 = (uint)*(undefined8 *)pNode;
  if ((~uVar3 & 0x9fffffff) == 0) {
    return 0;
  }
  if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x428,"int Gia_NodeDeref_rec(Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar1 = pNode + -(ulong)(uVar3 & 0x1fffffff);
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pGVar1) && (pGVar1 < pGVar2 + p->nObjs)) {
    iVar5 = (int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555;
    iVar6 = p->pRefs[iVar5];
    if (iVar6 < 1) {
      __assert_fail("Gia_ObjRefNum(p, pFanin) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                    ,0x42a,"int Gia_NodeDeref_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar4 = 0;
    iVar6 = iVar6 + -1;
    p->pRefs[iVar5] = iVar6;
    if (iVar6 == 0) {
      iVar4 = Gia_NodeDeref_rec(p,pGVar1);
    }
    pGVar1 = pNode + -(ulong)(*(uint *)&pNode->field_0x4 & 0x1fffffff);
    pGVar2 = p->pObjs;
    if ((pGVar2 <= pGVar1) && (pGVar1 < pGVar2 + p->nObjs)) {
      iVar5 = (int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555;
      iVar6 = p->pRefs[iVar5];
      if (0 < iVar6) {
        iVar6 = iVar6 + -1;
        p->pRefs[iVar5] = iVar6;
        if (iVar6 == 0) {
          iVar6 = Gia_NodeDeref_rec(p,pGVar1);
          iVar4 = iVar4 + iVar6;
        }
        return iVar4 + 1;
      }
      __assert_fail("Gia_ObjRefNum(p, pFanin) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                    ,0x42e,"int Gia_NodeDeref_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_NodeDeref_rec( Gia_Man_t * p, Gia_Obj_t * pNode )
{
    Gia_Obj_t * pFanin;
    int Counter = 0;
    if ( Gia_ObjIsCi(pNode) )
        return 0;
    assert( Gia_ObjIsAnd(pNode) );
    pFanin = Gia_ObjFanin0(pNode);
    assert( Gia_ObjRefNum(p, pFanin) > 0 );
    if ( Gia_ObjRefDec(p, pFanin) == 0 )
        Counter += Gia_NodeDeref_rec( p, pFanin );
    pFanin = Gia_ObjFanin1(pNode);
    assert( Gia_ObjRefNum(p, pFanin) > 0 );
    if ( Gia_ObjRefDec(p, pFanin) == 0 )
        Counter += Gia_NodeDeref_rec( p, pFanin );
    return Counter + 1;
}